

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O1

void bitwise_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (n < 1) {
    iVar1 = 0x7ffffffe;
  }
  else {
    iVar1 = *vals;
  }
  *accum = iVar1;
  if (1 < n) {
    uVar4 = 1;
    do {
      uVar3 = vals[uVar4];
      if (uVar3 != 0x7ffffffe) {
        if (uVar3 == 0x7fffffff) {
          uVar3 = 0x7fffffff;
          if (*accum != 0x7ffffffe) goto LAB_001c4daf;
        }
        else {
          uVar2 = *accum;
          if (0x7ffffffd < (int)uVar2) {
            uVar2 = 0;
          }
          uVar3 = uVar3 | uVar2;
        }
        *accum = uVar3;
      }
LAB_001c4daf:
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  if (n < 1) {
    iVar1 = 0x7ffffffe;
  }
  else {
    iVar1 = *auxs;
  }
  *accum_aux = iVar1;
  if (1 < n) {
    uVar4 = 1;
    do {
      uVar3 = auxs[uVar4];
      if (uVar3 != 0x7ffffffe) {
        if (uVar3 == 0x7fffffff) {
          uVar3 = 0x7fffffff;
          if (*accum_aux != 0x7ffffffe) goto LAB_001c4e0b;
        }
        else {
          uVar2 = *accum_aux;
          if (0x7ffffffd < (int)uVar2) {
            uVar2 = 0;
          }
          uVar3 = uVar3 | uVar2;
        }
        *accum_aux = uVar3;
      }
LAB_001c4e0b:
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  return;
}

Assistant:

static void bitwise_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = (n > 0) ? vals[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = (n > 0) ? auxs[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(auxs[i], accum_aux);
	}
}